

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testTempContext(string *tempdir)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *in_RCX;
  char *pcVar4;
  exr_context_t c;
  int pc;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  c = (exr_context_t)0x0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_80 = 0x68;
  local_28 = 0xbf800000fffffffe;
  pc = -1;
  puts("Testing initial temporary context API");
  iVar1 = exr_start_temporary_context(0,(tempdir->_M_dataplus)._M_p,0);
  if (iVar1 != 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"\n    expected: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,3);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_temporary_context (__null, tempdir.c_str (), __null)",(char *)0x1ba,
                   0x15551d,in_RCX);
  }
  iVar1 = exr_start_temporary_context(&c,(tempdir->_M_dataplus)._M_p,0);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_start_temporary_context (&c, tempdir.c_str (), __null)",(char *)0x1bc,
                   0x15551d,in_RCX);
  }
  iVar1 = exr_get_count(c,&pc);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_get_count (c, &pc)",(char *)0x1bd,0x15551d,in_RCX);
  }
  if (pc == 1) {
    exr_finish(&c);
    iVar1 = exr_start_temporary_context(&c,(tempdir->_M_dataplus)._M_p,&local_80);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,") ");
      pcVar4 = (char *)exr_get_default_error_message(iVar1);
      poVar2 = std::operator<<(poVar2,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar2);
      core_test_fail("exr_start_temporary_context ( &c, tempdir.c_str (), &cinit)",(char *)0x1c2,
                     0x15551d,in_RCX);
    }
    pcVar4 = (char *)0x438;
    iVar1 = exr_initialize_required_attr_simple(c,0,0x780,0x438,0);
    if (iVar1 == 0) {
      exr_finish(&c);
      puts("ok.");
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2,") ");
    pcVar3 = (char *)exr_get_default_error_message(iVar1);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    core_test_fail("exr_initialize_required_attr_simple ( c, 0, 1920, 1080, EXR_COMPRESSION_NONE)",
                   (char *)0x1c4,0x15551d,pcVar4);
  }
  core_test_fail("pc == 1",(char *)0x1be,0x15551d,in_RCX);
}

Assistant:

void testTempContext (const std::string& tempdir)
{
    exr_context_t c = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    int pc = -1;

    printf ("Testing initial temporary context API\n");

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_temporary_context (NULL, tempdir.c_str (), NULL));

    EXRCORE_TEST_RVAL (exr_start_temporary_context (&c, tempdir.c_str (), NULL));
    EXRCORE_TEST_RVAL (exr_get_count (c, &pc));
    EXRCORE_TEST (pc == 1);
    exr_finish (&c);

    EXRCORE_TEST_RVAL (exr_start_temporary_context (
                           &c, tempdir.c_str (), &cinit));
    EXRCORE_TEST_RVAL (exr_initialize_required_attr_simple (
                           c, 0, 1920, 1080, EXR_COMPRESSION_NONE));
    exr_finish (&c);

    printf ("ok.\n");
}